

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum.cpp
# Opt level: O3

void __thiscall Timidity::ToneBank::~ToneBank(ToneBank *this)

{
  ToneBankElement *pTVar1;
  Instrument *this_00;
  long lVar2;
  int i;
  long lVar3;
  
  pTVar1 = this->tone;
  if (pTVar1 != (ToneBankElement *)0x0) {
    lVar3._0_4_ = pTVar1[-1].fontnote;
    lVar3._4_1_ = pTVar1[-1].strip_loop;
    lVar3._5_1_ = pTVar1[-1].strip_envelope;
    lVar3._6_1_ = pTVar1[-1].strip_tail;
    lVar3._7_1_ = pTVar1[-1].field_0x1f;
    if (lVar3 != 0) {
      lVar2 = lVar3 << 5;
      do {
        FString::~FString((FString *)((long)&pTVar1[-1].name.Chars + lVar2));
        lVar2 = lVar2 + -0x20;
      } while (lVar2 != 0);
    }
    operator_delete__(&pTVar1[-1].fontnote,lVar3 << 5 | 8);
  }
  lVar3 = 0;
  do {
    this_00 = this->instrument[lVar3];
    if ((undefined1 *)0x1 < (undefined1 *)((long)&this_00->samples + 1U)) {
      Instrument::~Instrument(this_00);
      operator_delete(this_00,0x10);
      this->instrument[lVar3] = (Instrument *)0x0;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x80);
  return;
}

Assistant:

ToneBank::~ToneBank()
{
	delete[] tone;
	for (int i = 0; i < MAXPROG; i++)
	{
		if (instrument[i] != NULL && instrument[i] != MAGIC_LOAD_INSTRUMENT)
		{
			delete instrument[i];
			instrument[i] = NULL;
		}
	}
}